

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O3

void ZXing::QRCode::EmbedPositionDetectionPattern(int xStart,int yStart,TritMatrix *matrix)

{
  int iVar1;
  pointer pTVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  undefined4 uVar7;
  value_t vVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar19;
  uint uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar1 = matrix->_width;
  pTVar2 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start + (long)yStart * (long)iVar1 + (long)xStart + 6;
  lVar5 = 0;
  do {
    uVar6 = (int)lVar5 - 3;
    uVar3 = -uVar6;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    uVar12 = -(uint)(-0x7fffffff < (int)(uVar3 ^ 0x80000000));
    uVar13 = -(uint)(-0x7ffffffe < (int)(uVar3 ^ 0x80000000));
    uVar14 = -(uint)(-0x7ffffffd < (int)(uVar3 ^ 0x80000000));
    uVar12 = ~uVar12 & 1 | uVar3 & uVar12;
    uVar13 = ~uVar13 & 2 | uVar3 & uVar13;
    uVar15 = -(uint)(-0x7ffffffd < (int)(uVar3 ^ 0x80000000));
    uVar19 = -(uint)(-0x7ffffffe < (int)(uVar3 ^ 0x80000000));
    uVar20 = -(uint)(-0x7fffffff < (int)(uVar3 ^ 0x80000000));
    auVar16._0_4_ = -(uint)((~uVar15 & 3 | uVar3 & uVar15) == 2);
    auVar16._4_4_ = -(uint)((~uVar19 & 2 | uVar3 & uVar19) == 2);
    auVar16._8_4_ = -(uint)((~uVar20 & 1 | uVar3 & uVar20) == 2);
    auVar16._12_4_ = -(uint)((uVar3 & -(uint)(-0x80000000 < (int)(uVar3 ^ 0x80000000))) == 2);
    auVar17 = packssdw(auVar16,auVar16);
    auVar18._8_4_ = 0xffffffff;
    auVar18._0_8_ = 0xffffffffffffffff;
    auVar18._12_4_ = 0xffffffff;
    auVar18 = packsswb(auVar17 ^ auVar18,auVar17 ^ auVar18);
    *(uint *)(pTVar2 + -6) = auVar18._0_4_ & 0x1010101;
    auVar17._0_4_ = -(uint)(uVar12 == 2);
    auVar17._4_4_ = -(uint)(uVar12 == 2);
    auVar17._8_4_ = -(uint)(uVar13 == 2);
    auVar17._12_4_ = -(uint)(uVar13 == 2);
    uVar7 = movmskpd(uVar6,auVar17);
    vVar8 = (value_t)uVar7 ^ (empty_v|true_v);
    pTVar2[-2].value = vVar8 & true_v;
    pTVar2[-1].value = vVar8 >> 1;
    pTVar2->value = (~uVar14 & 3 | uVar3 & uVar14) != 2;
    lVar5 = lVar5 + 1;
    pTVar2 = pTVar2 + iVar1;
  } while (lVar5 != 7);
  iVar1 = matrix->_width;
  iVar11 = iVar1 * (yStart + -1);
  pTVar2 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = xStart + iVar11 + 7;
  iVar9 = 0;
  do {
    iVar4 = xStart + -1 + iVar9;
    if (-1 < iVar4) {
      iVar10 = matrix->_height;
      if (((0 < yStart) && (iVar4 < iVar1)) && (yStart <= iVar10)) {
        pTVar2[(uint)(iVar11 + xStart + -1 + iVar9)].value = false_v;
        iVar10 = matrix->_height;
      }
      if (((-8 < yStart) && (iVar4 < iVar1)) && (yStart + 7 < iVar10)) {
        pTVar2[(uint)(iVar1 * (yStart + 7) + xStart + -1 + iVar9)].value = false_v;
      }
    }
    iVar4 = yStart + -1 + iVar9;
    if (xStart < 1) {
      if (-8 < xStart) goto LAB_0018e3d9;
    }
    else {
      if (((-1 < iVar4) && (xStart <= iVar1)) && (iVar4 < matrix->_height)) {
        pTVar2[uVar3 - 8].value = false_v;
      }
LAB_0018e3d9:
      if (((-1 < iVar4) && (xStart + 7 < iVar1)) && (iVar4 < matrix->_height)) {
        pTVar2[uVar3].value = false_v;
      }
    }
    iVar9 = iVar9 + 1;
    uVar3 = uVar3 + iVar1;
    if (iVar9 == 9) {
      return;
    }
  } while( true );
}

Assistant:

static void EmbedPositionDetectionPattern(int xStart, int yStart, TritMatrix& matrix)
{
	for (int y = 0; y < 7; ++y)
		for (int x = 0; x < 7; ++x)
			matrix.set(xStart + x, yStart + y, maxAbsComponent(PointI(x, y) - PointI(3, 3)) != 2);

	// Surround the 7x7 pattern with one line of white space (separation pattern)
	auto setIfInside = [&](int x, int y) {
		if( x >= 0 && x < matrix.width() && y >= 0 && y < matrix.height())
			matrix.set(x, y, 0);
	};

	for (int i = -1; i < 8; ++i) {
		setIfInside(xStart + i, yStart - 1); // top
		setIfInside(xStart + i, yStart + 7); // bottom
		setIfInside(xStart - 1, yStart + i); // left
		setIfInside(xStart + 7, yStart + i); // right
	}
}